

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1;
  SyntaxNode *args_5;
  SyntaxList<slang::syntax::CaseItemSyntax> *args_8;
  CaseStatementSyntax *pCVar1;
  NamedLabelSyntax *local_98;
  DeepCloneVisitor visitor;
  Token local_80;
  Token local_70;
  Token local_60;
  Token local_50;
  DeepCloneVisitor visitor_1;
  
  if (*(SyntaxNode **)(__fn + 0x18) == (SyntaxNode *)0x0) {
    local_98 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_98 = (NamedLabelSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x18),&visitor,(BumpAllocator *)__child_stack);
  }
  args_1 = deepClone<slang::syntax::AttributeInstanceSyntax>
                     ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x20),
                      (BumpAllocator *)__child_stack);
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0x58),(BumpAllocator *)__child_stack);
  local_70 = parsing::Token::deepClone((Token *)(__fn + 0x68),(BumpAllocator *)__child_stack);
  local_80 = parsing::Token::deepClone((Token *)(__fn + 0x78),(BumpAllocator *)__child_stack);
  args_5 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x88),&visitor_1,(BumpAllocator *)__child_stack);
  _visitor_1 = parsing::Token::deepClone((Token *)(__fn + 0x90),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0xa0),(BumpAllocator *)__child_stack);
  args_8 = deepClone<slang::syntax::CaseItemSyntax>
                     ((SyntaxList<slang::syntax::CaseItemSyntax> *)(__fn + 0xb0),
                      (BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0xe8),(BumpAllocator *)__child_stack);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::CaseStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::CaseItemSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_98,args_1,(Token *)&visitor,&local_70,
                      &local_80,(ExpressionSyntax *)args_5,(Token *)&visitor_1,&local_50,args_8,
                      &local_60);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const CaseStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<CaseStatementSyntax>(
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.uniqueOrPriority.deepClone(alloc),
        node.caseKeyword.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.expr, alloc),
        node.closeParen.deepClone(alloc),
        node.matchesOrInside.deepClone(alloc),
        *deepClone(node.items, alloc),
        node.endcase.deepClone(alloc)
    );
}